

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::x86::RACFGBuilder::onRet(RACFGBuilder *this,FuncRetNode *funcRet,RAInstBuilder *ib)

{
  byte bVar1;
  long lVar2;
  Error EVar3;
  FuncValue *pFVar4;
  uint *puVar5;
  uint32_t i;
  size_t index;
  uint *puVar6;
  RegGroup group;
  RAWorkReg *workReg;
  RAInstBuilder *local_38;
  
  bVar1 = funcRet->field_0x12;
  puVar6 = (uint *)&funcRet->field_0x40;
  lVar2 = *(long *)(*(long *)this + 0x98);
  index = 0;
  local_38 = ib;
  do {
    if (bVar1 == index) {
      return 0;
    }
    if (*puVar6 != 0) {
      pFVar4 = FuncValuePack::operator[]((FuncValuePack *)(lVar2 + 0xc0),index);
      if ((pFVar4->_data >> 8 & 1) == 0) {
        return 0x19;
      }
      if ((pFVar4->_data & 0xff000000) != 0x16000000) {
        if ((*puVar6 & 7) != 1) {
          return 0x19;
        }
        if (puVar6[1] - 0x100 < 0xfffffeff) {
          EVar3 = BaseRAPass::virtIndexAsWorkReg(*(BaseRAPass **)this,puVar6[1] - 0x100,&workReg);
          if (EVar3 != 0) {
            return EVar3;
          }
          group = (byte)workReg[0x21] & kMaxValue;
          puVar5 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                             ((Array<unsigned_int,_4UL> *)(*(long *)this + 0x118),&group);
          EVar3 = RAInstBuilder::add(local_38,workReg,kUse|kRead,*puVar5,
                                     (uint)*(byte *)((long)&pFVar4->_data + 2),0,*puVar5,0xff,0,0,
                                     0xffffffff);
          if (EVar3 != 0) {
            return EVar3;
          }
        }
      }
    }
    index = index + 1;
    puVar6 = puVar6 + 4;
  } while( true );
}

Assistant:

Error RACFGBuilder::onRet(FuncRetNode* funcRet, RAInstBuilder& ib) noexcept {
  const FuncDetail& funcDetail = _pass->func()->detail();
  const Operand* opArray = funcRet->operands();
  uint32_t opCount = funcRet->opCount();

  for (uint32_t i = 0; i < opCount; i++) {
    const Operand& op = opArray[i];
    if (op.isNone()) continue;

    const FuncValue& ret = funcDetail.ret(i);
    if (ASMJIT_UNLIKELY(!ret.isReg()))
      return DebugUtils::errored(kErrorInvalidAssignment);

    // Not handled here...
    if (ret.regType() == RegType::kX86_St)
      continue;

    if (op.isReg()) {
      // Register return value.
      const Reg& reg = op.as<Reg>();
      uint32_t vIndex = Operand::virtIdToIndex(reg.id());

      if (vIndex < Operand::kVirtIdCount) {
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(vIndex, &workReg));

        RegGroup group = workReg->group();
        RegMask inOutRegs = _pass->_availableRegs[group];
        ASMJIT_PROPAGATE(ib.add(workReg, RATiedFlags::kUse | RATiedFlags::kRead, inOutRegs, ret.regId(), 0, inOutRegs, BaseReg::kIdBad, 0));
      }
    }
    else {
      return DebugUtils::errored(kErrorInvalidAssignment);
    }
  }

  return kErrorOk;
}